

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_rotate.c
# Opt level: O3

void gdImageSkewX(gdImagePtr dst,gdImagePtr src,int uRow,int iOffset,double dWeight,int clrBack,
                 int ignoretransparent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint color;
  undefined8 uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int g;
  int color_00;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  int a;
  int b;
  int iVar15;
  code *local_48;
  
  if (src->trueColor == 0) {
    color_00 = src->green[clrBack] * 0x100 + src->red[clrBack] * 0x10000 + src->blue[clrBack] +
               src->alpha[clrBack] * 0x1000000;
    local_48 = gdImageGetPixel;
  }
  else {
    local_48 = gdImageGetTrueColorPixel;
    color_00 = clrBack;
  }
  if (iOffset < 1) {
    iVar13 = 0;
  }
  else {
    iVar11 = 0;
    do {
      gdImageSetPixel(dst,iVar11,uRow,color_00);
      iVar11 = iVar11 + 1;
      iVar13 = iOffset;
    } while (iOffset != iVar11);
  }
  uVar12 = (ulong)(uint)clrBack;
  if (iVar13 < dst->sx) {
    gdImageSetPixel(dst,iVar13,uRow,color_00);
  }
  if (src->sx < 1) {
    iVar13 = 0;
    uVar14 = 0;
  }
  else {
    iVar13 = 0;
    do {
      uVar5 = (*local_48)(src,iVar13,uRow);
      color = (uint)uVar5;
      uVar4 = (uint)((ulong)uVar5 >> 8);
      uVar10 = (uint)((ulong)uVar5 >> 0x10);
      uVar14 = (uint)((ulong)uVar5 >> 0x18);
      if (src->trueColor == 0) {
        uVar6 = src->red[(int)color];
        uVar7 = src->green[(int)color];
        uVar8 = src->blue[(int)color];
        uVar9 = src->alpha[(int)color];
      }
      else {
        uVar6 = uVar10 & 0xff;
        uVar7 = uVar4 & 0xff;
        uVar8 = color & 0xff;
        uVar9 = uVar14 & 0x7f;
      }
      iVar11 = (int)((double)(int)uVar6 * dWeight);
      if (0xfe < iVar11) {
        iVar11 = 0xff;
      }
      iVar1 = (int)((double)(int)uVar7 * dWeight);
      if (0xfe < (int)((double)(int)uVar7 * dWeight)) {
        iVar1 = 0xff;
      }
      iVar2 = (int)((double)(int)uVar8 * dWeight);
      if (0xfe < (int)((double)(int)uVar8 * dWeight)) {
        iVar2 = 0xff;
      }
      iVar3 = (int)((double)(int)uVar9 * dWeight);
      if (0x7e < (int)((double)(int)uVar9 * dWeight)) {
        iVar3 = 0x7f;
      }
      uVar6 = (uint)uVar12;
      if (src->trueColor == 0) {
        iVar15 = (src->red[(int)color] - iVar11) + src->red[(int)uVar6];
        g = (src->green[(int)color] - iVar1) + src->green[(int)uVar6];
        b = (src->blue[(int)color] - iVar2) + src->blue[(int)uVar6];
        uVar14 = src->alpha[(int)color];
        uVar10 = src->alpha[(int)uVar6];
      }
      else {
        iVar15 = (((uint)(uVar12 >> 0x10) & 0xff) + (uVar10 & 0xff)) - iVar11;
        g = (((uint)(uVar12 >> 8) & 0xff) + (uVar4 & 0xff)) - iVar1;
        b = ((uVar6 & 0xff) + (color & 0xff)) - iVar2;
        uVar14 = uVar14 & 0x7f;
        uVar10 = uVar6 >> 0x18 & 0x7f;
      }
      a = (uVar14 - iVar3) + uVar10;
      if (0xfe < iVar15) {
        iVar15 = 0xff;
      }
      if (0xfe < g) {
        g = 0xff;
      }
      if (0xfe < b) {
        b = 0xff;
      }
      if (0x7e < a) {
        a = 0x7f;
      }
      if (((ignoretransparent == 0) || (color != dst->transparent)) &&
         (color = gdImageColorAllocateAlpha(dst,iVar15,g,b,a), color == 0xffffffff)) {
        color = gdImageColorClosestAlpha(dst,iVar15,g,b,a);
      }
      iVar15 = iOffset + iVar13;
      if ((-1 < iVar15) && (iVar15 < dst->sx)) {
        gdImageSetPixel(dst,iVar15,uRow,color);
      }
      uVar14 = iVar11 * 0x10000 + iVar2 + iVar1 * 0x100 + iVar3 * 0x1000000;
      iVar13 = iVar13 + 1;
      uVar12 = (ulong)uVar14;
    } while (iVar13 < src->sx);
  }
  iVar13 = iVar13 + iOffset;
  if (iVar13 < dst->sx) {
    gdImageSetPixel(dst,iVar13,uRow,uVar14);
  }
  gdImageSetPixel(dst,iOffset,uRow,color_00);
  for (; iVar13 < dst->sx; iVar13 = iVar13 + 1) {
    gdImageSetPixel(dst,iVar13,uRow,color_00);
  }
  return;
}

Assistant:

void gdImageSkewX (gdImagePtr dst, gdImagePtr src, int uRow, int iOffset, double dWeight, int clrBack, int ignoretransparent)
{
	int i, r, g, b, a, clrBackR, clrBackG, clrBackB, clrBackA;
	FuncPtr f;

	int pxlOldLeft, pxlLeft=0, pxlSrc;

	/* Keep clrBack as color index if required */
	if (src->trueColor) {
		pxlOldLeft = clrBack;
		f = gdImageGetTrueColorPixel;
	} else {
		pxlOldLeft = clrBack;
		clrBackR = gdImageRed(src, clrBack);
		clrBackG = gdImageGreen(src, clrBack);
		clrBackB = gdImageBlue(src, clrBack);
		clrBackA = gdImageAlpha(src, clrBack);
		clrBack =  gdTrueColorAlpha(clrBackR, clrBackG, clrBackB, clrBackA);
		f = gdImageGetPixel;
	}

	for (i = 0; i < iOffset; i++) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}

	for (i = 0; i < src->sx; i++) {
		pxlSrc = f (src,i,uRow);

		r = (int)(gdImageRed(src,pxlSrc) * dWeight);
		g = (int)(gdImageGreen(src,pxlSrc) * dWeight);
		b = (int)(gdImageBlue(src,pxlSrc) * dWeight);
		a = (int)(gdImageAlpha(src,pxlSrc) * dWeight);

		if (r>255) {
			r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		pxlLeft = gdTrueColorAlpha(r, g, b, a);

		r = gdImageRed(src,pxlSrc)   - (r - gdImageRed(src,pxlOldLeft));
		g = gdImageGreen(src,pxlSrc) - (g - gdImageGreen(src,pxlOldLeft));
		b = gdImageBlue(src,pxlSrc)  - (b - gdImageBlue(src,pxlOldLeft));
		a = gdImageAlpha(src,pxlSrc) - (a - gdImageAlpha(src,pxlOldLeft));

		if (r>255) {
			r = 255;
		}

		if (g>255) {
			g = 255;
		}

		if (b>255) {
			b = 255;
		}

		if (a>127) {
			a = 127;
		}

		if (ignoretransparent && pxlSrc == dst->transparent) {
			pxlSrc = dst->transparent;
		} else {
			pxlSrc = gdImageColorAllocateAlpha(dst, r, g, b, a);

			if (pxlSrc == -1) {
				pxlSrc = gdImageColorClosestAlpha(dst, r, g, b, a);
			}
		}

		if ((i + iOffset >= 0) && (i + iOffset < dst->sx)) {
			gdImageSetPixel (dst, i+iOffset, uRow,  pxlSrc);
		}

		pxlOldLeft = pxlLeft;
	}

	i += iOffset;

	if (i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, pxlLeft);
	}

	gdImageSetPixel (dst, iOffset, uRow, clrBack);

	i--;

	while (++i < dst->sx) {
		gdImageSetPixel (dst, i, uRow, clrBack);
	}
}